

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateStringLiteral(ExpressionEvalContext *ctx,ExprStringLiteral *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  _func_int **pp_Var3;
  TypeBase *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  
  pAVar2 = ctx->ctx->allocator;
  iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
  pp_Var3 = (_func_int **)expression->value;
  uVar1 = expression->length;
  pEVar6->typeID = 5;
  pTVar4 = (expression->super_ExprBase).type;
  pEVar6->source = (expression->super_ExprBase).source;
  pEVar6->type = pTVar4;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002236d0;
  pEVar6[1]._vptr_ExprBase = pp_Var3;
  pEVar6[1].typeID = uVar1;
  pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
  return pEVar6;
}

Assistant:

ExprBase* EvaluateStringLiteral(ExpressionEvalContext &ctx, ExprStringLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprStringLiteral>()) ExprStringLiteral(expression->source, expression->type, expression->value, expression->length));
}